

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::ORA_ID_X(CPU *this)

{
  byte bVar1;
  uint16_t address;
  CPU *this_local;
  
  this->cycles = 6;
  bVar1 = GetByte(this);
  address = ReadWord(this,(ushort)bVar1 + (ushort)this->X);
  bVar1 = ReadByte(this,address);
  this->A = this->A | bVar1;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->A == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->A & 0x80) != 0 && -1 < (int)(this->A & 0x80)) << 7;
  return;
}

Assistant:

void CPU::ORA_ID_X()
{
    cycles = 6;
    A |= ReadByte(ReadWord((uint16_t)(GetByte() + X)));
    cycles--;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}